

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport.c
# Opt level: O2

_Bool IoTHubTransport_SignalEndWorkerThread
                (TRANSPORT_HANDLE transportHandle,IOTHUB_CLIENT_CORE_HANDLE clientHandle)

{
  LOCK_RESULT LVar1;
  void *elements;
  size_t sVar2;
  LOGGER_LOG p_Var3;
  int iVar4;
  _Bool _Var5;
  char *pcVar6;
  TRANSPORT_HANDLE_DATA *transportData;
  
  if (clientHandle == (IOTHUB_CLIENT_CORE_HANDLE)0x0 || transportHandle == (TRANSPORT_HANDLE)0x0) {
    return false;
  }
  LVar1 = Lock(transportHandle->clientsLockHandle);
  if (LVar1 == LOCK_OK) {
    elements = VECTOR_find_if(transportHandle->clients,find_by_handle,clientHandle);
    if (elements != (void *)0x0) {
      VECTOR_erase(transportHandle->clients,elements,1);
    }
    if ((transportHandle->workerThreadHandle == (THREAD_HANDLE)0x0) ||
       (sVar2 = VECTOR_size(transportHandle->clients), sVar2 != 0)) {
      _Var5 = false;
    }
    else {
      stop_worker_thread(transportHandle);
      _Var5 = true;
    }
    LVar1 = Unlock(transportHandle->clientsLockHandle);
    if (LVar1 == LOCK_OK) {
      return _Var5;
    }
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return _Var5;
    }
    pcVar6 = "failed to unlock on signal_end_worker_thread";
    iVar4 = 0x143;
  }
  else {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return false;
    }
    pcVar6 = "failed to lock for signal_end_worker_thread";
    _Var5 = false;
    iVar4 = 0x126;
  }
  (*p_Var3)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport.c"
            ,"signal_end_worker_thread",iVar4,1,pcVar6);
  return _Var5;
}

Assistant:

bool IoTHubTransport_SignalEndWorkerThread(TRANSPORT_HANDLE transportHandle, IOTHUB_CLIENT_CORE_HANDLE clientHandle)
{
    bool okToJoin;
    if (!(transportHandle == NULL || clientHandle == NULL))
    {
        TRANSPORT_HANDLE_DATA * transportData = (TRANSPORT_HANDLE_DATA*)transportHandle;
        okToJoin = signal_end_worker_thread(transportData, clientHandle);
    }
    else
    {
        okToJoin = false;
    }
    return okToJoin;
}